

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

void __thiscall
pbrt::HaltonSampler::StartPixelSample(HaltonSampler *this,Point2i *p,int sampleIndex,int dim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int64_t iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  this->haltonIndex = 0;
  uVar6 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y *
          (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  if (1 < (int)uVar6) {
    iVar5 = this->haltonIndex;
    iVar3 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x;
    iVar1 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.y;
    lVar10 = 0;
    do {
      if (lVar10 == 0) {
        if (iVar3 < 1) {
          lVar9 = 0;
          goto LAB_003f5106;
        }
        lVar7 = 0;
        uVar4 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).x & 0x7f);
        iVar2 = iVar3;
        do {
          uVar8 = (uint)uVar4;
          uVar4 = uVar4 >> 1;
          lVar7 = (ulong)(uVar8 & 1) + lVar7 * 2;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        lVar9 = 0;
      }
      else {
        lVar9 = 4;
        if (iVar1 < 1) {
LAB_003f5106:
          lVar7 = 0;
        }
        else {
          lVar7 = 0;
          uVar4 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).y & 0x7f);
          iVar2 = iVar1;
          do {
            lVar7 = lVar7 * 3 + uVar4 % 3;
            iVar2 = iVar2 + -1;
            uVar4 = uVar4 / 3;
          } while (iVar2 != 0);
        }
      }
      iVar5 = iVar5 + this->multInverse[lVar10] * lVar7 *
                      (long)((int)uVar6 / *(int *)((long)this->multInverse + lVar9 + -0x10));
      bVar11 = lVar10 == 0;
      lVar10 = lVar10 + 1;
    } while (bVar11);
    this->haltonIndex = iVar5 % (long)(ulong)uVar6;
  }
  this->haltonIndex = this->haltonIndex + (long)(int)(uVar6 * sampleIndex);
  iVar3 = 2;
  if (2 < dim) {
    iVar3 = dim;
  }
  this->dimension = iVar3;
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int sampleIndex, int dim) {
        haltonIndex = 0;
        int sampleStride = baseScales[0] * baseScales[1];
        // Compute Halton sample offset for first sample in pixel _p_
        if (sampleStride > 1) {
            Point2i pm(Mod(p[0], MaxHaltonResolution), Mod(p[1], MaxHaltonResolution));
            for (int i = 0; i < 2; ++i) {
                uint64_t dimOffset =
                    (i == 0) ? InverseRadicalInverse(pm[i], 2, baseExponents[i])
                             : InverseRadicalInverse(pm[i], 3, baseExponents[i]);
                haltonIndex +=
                    dimOffset * (sampleStride / baseScales[i]) * multInverse[i];
            }
            haltonIndex %= sampleStride;
        }

        haltonIndex += sampleIndex * sampleStride;
        dimension = std::max(2, dim);
    }